

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::sse2::SphereMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  byte bVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ulong uVar20;
  RTCFilterFunctionN p_Var21;
  RayHitK<4> *pRVar22;
  long lVar23;
  Scene *pSVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  float fVar44;
  float fVar46;
  float fVar48;
  undefined1 auVar32 [16];
  uint uVar31;
  uint uVar45;
  uint uVar47;
  uint uVar49;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uint uVar50;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar83;
  undefined1 auVar82 [16];
  uint uVar84;
  uint uVar85;
  uint uVar86;
  uint uVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  uint uVar111;
  uint uVar112;
  uint uVar113;
  uint uVar114;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<4> h;
  undefined1 local_248 [16];
  RayQueryContext *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined4 local_20c;
  RTCFilterFunctionNArguments local_208;
  undefined8 local_1d8;
  uint uStack_1d0;
  uint uStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8 [4];
  float local_198 [4];
  float local_188 [4];
  float local_178 [6];
  Scene *local_160;
  undefined1 local_158 [16];
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  uint local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar24 = context->scene;
  local_d8[0] = sphere->sharedGeomID;
  pGVar7 = (pSVar24->geometries).items[local_d8[0]].ptr;
  lVar23 = *(long *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(lVar23 + (sphere->primIDs).field_0.i[0] * _Var8);
  pfVar2 = (float *)(lVar23 + (sphere->primIDs).field_0.i[1] * _Var8);
  pfVar3 = (float *)(lVar23 + (sphere->primIDs).field_0.i[2] * _Var8);
  pfVar4 = (float *)(lVar23 + (sphere->primIDs).field_0.i[3] * _Var8);
  bVar6 = sphere->numPrimitives;
  local_d8[1] = local_d8[0];
  local_d8[2] = local_d8[0];
  local_d8[3] = local_d8[0];
  fVar102 = *(float *)(ray + k * 4);
  fVar103 = *(float *)(ray + k * 4 + 0x10);
  fVar105 = *(float *)(ray + k * 4 + 0x20);
  fVar106 = *(float *)(ray + k * 4 + 0x40);
  fVar109 = *(float *)(ray + k * 4 + 0x50);
  fVar110 = *(float *)(ray + k * 4 + 0x60);
  auVar81._0_4_ = fVar106 * fVar106 + fVar109 * fVar109 + fVar110 * fVar110;
  auVar81._4_4_ = auVar81._0_4_;
  auVar81._8_4_ = auVar81._0_4_;
  auVar81._12_4_ = auVar81._0_4_;
  auVar79 = rcpps(ZEXT416((uint)(fVar110 * fVar110)),auVar81);
  fVar65 = auVar79._0_4_;
  fVar73 = auVar79._4_4_;
  fVar74 = auVar79._8_4_;
  fVar75 = auVar79._12_4_;
  fVar65 = (1.0 - auVar81._0_4_ * fVar65) * fVar65 + fVar65;
  fVar73 = (1.0 - auVar81._0_4_ * fVar73) * fVar73 + fVar73;
  fVar74 = (1.0 - auVar81._0_4_ * fVar74) * fVar74 + fVar74;
  fVar75 = (1.0 - auVar81._0_4_ * fVar75) * fVar75 + fVar75;
  fVar90 = ((*pfVar1 - fVar102) * fVar106 +
           (pfVar1[1] - fVar103) * fVar109 + (pfVar1[2] - fVar105) * fVar110) * fVar65;
  fVar91 = ((*pfVar2 - fVar102) * fVar106 +
           (pfVar2[1] - fVar103) * fVar109 + (pfVar2[2] - fVar105) * fVar110) * fVar73;
  fVar92 = ((*pfVar3 - fVar102) * fVar106 +
           (pfVar3[1] - fVar103) * fVar109 + (pfVar3[2] - fVar105) * fVar110) * fVar74;
  fVar93 = ((*pfVar4 - fVar102) * fVar106 +
           (pfVar4[1] - fVar103) * fVar109 + (pfVar4[2] - fVar105) * fVar110) * fVar75;
  fVar98 = (*pfVar1 - fVar102) - fVar106 * fVar90;
  fVar99 = (*pfVar2 - fVar102) - fVar106 * fVar91;
  fVar100 = (*pfVar3 - fVar102) - fVar106 * fVar92;
  fVar101 = (*pfVar4 - fVar102) - fVar106 * fVar93;
  fVar94 = (pfVar1[1] - fVar103) - fVar109 * fVar90;
  fVar95 = (pfVar2[1] - fVar103) - fVar109 * fVar91;
  fVar96 = (pfVar3[1] - fVar103) - fVar109 * fVar92;
  fVar97 = (pfVar4[1] - fVar103) - fVar109 * fVar93;
  fVar102 = (pfVar1[2] - fVar105) - fVar110 * fVar90;
  fVar103 = (pfVar2[2] - fVar105) - fVar110 * fVar91;
  fVar104 = (pfVar3[2] - fVar105) - fVar110 * fVar92;
  fVar105 = (pfVar4[2] - fVar105) - fVar110 * fVar93;
  auVar80._0_4_ = fVar98 * fVar98 + fVar94 * fVar94 + fVar102 * fVar102;
  auVar80._4_4_ = fVar99 * fVar99 + fVar95 * fVar95 + fVar103 * fVar103;
  auVar80._8_4_ = fVar100 * fVar100 + fVar96 * fVar96 + fVar104 * fVar104;
  auVar80._12_4_ = fVar101 * fVar101 + fVar97 * fVar97 + fVar105 * fVar105;
  fVar30 = pfVar1[3] * pfVar1[3];
  fVar44 = pfVar2[3] * pfVar2[3];
  fVar46 = pfVar3[3] * pfVar3[3];
  fVar48 = pfVar4[3] * pfVar4[3];
  bVar15 = bVar6 != 0 && auVar80._0_4_ <= fVar30;
  auVar79._0_4_ = -(uint)bVar15;
  bVar16 = 1 < bVar6 && auVar80._4_4_ <= fVar44;
  auVar79._4_4_ = -(uint)bVar16;
  bVar14 = 2 < bVar6 && auVar80._8_4_ <= fVar46;
  auVar79._8_4_ = -(uint)bVar14;
  bVar13 = 3 < bVar6 && auVar80._12_4_ <= fVar48;
  auVar79._12_4_ = -(uint)bVar13;
  iVar17 = movmskps(local_d8[0],auVar79);
  if (iVar17 != 0) {
    auVar66._0_4_ = fVar65 * (fVar30 - auVar80._0_4_);
    auVar66._4_4_ = fVar73 * (fVar44 - auVar80._4_4_);
    auVar66._8_4_ = fVar74 * (fVar46 - auVar80._8_4_);
    auVar66._12_4_ = fVar75 * (fVar48 - auVar80._12_4_);
    auVar81 = sqrtps(auVar80,auVar66);
    fVar46 = auVar81._0_4_;
    fVar74 = fVar90 - fVar46;
    fVar48 = auVar81._4_4_;
    fVar75 = fVar91 - fVar48;
    fVar65 = auVar81._8_4_;
    fVar88 = fVar92 - fVar65;
    fVar73 = auVar81._12_4_;
    fVar89 = fVar93 - fVar73;
    fVar90 = fVar90 + fVar46;
    fVar91 = fVar91 + fVar48;
    fVar92 = fVar92 + fVar65;
    fVar93 = fVar93 + fVar73;
    fVar30 = *(float *)(ray + k * 4 + 0x30);
    fVar44 = *(float *)(ray + k * 4 + 0x80);
    uVar111 = -(uint)(fVar74 <= fVar44 && fVar30 <= fVar74);
    uVar112 = -(uint)(fVar75 <= fVar44 && fVar30 <= fVar75);
    uVar113 = -(uint)(fVar88 <= fVar44 && fVar30 <= fVar88);
    uVar114 = -(uint)(fVar89 <= fVar44 && fVar30 <= fVar89);
    uVar50 = uVar111 & auVar79._0_4_;
    uVar62 = uVar112 & auVar79._4_4_;
    auVar32._4_4_ = uVar62;
    auVar32._0_4_ = uVar50;
    uVar63 = uVar113 & auVar79._8_4_;
    uVar64 = uVar114 & auVar79._12_4_;
    uVar84 = -(uint)((fVar90 <= fVar44 && fVar30 <= fVar90) && bVar15);
    uVar85 = -(uint)((fVar91 <= fVar44 && fVar30 <= fVar91) && bVar16);
    uVar86 = -(uint)((fVar92 <= fVar44 && fVar30 <= fVar92) && bVar14);
    uVar87 = -(uint)((fVar93 <= fVar44 && fVar30 <= fVar93) && bVar13);
    auVar32._8_4_ = uVar63;
    auVar32._12_4_ = uVar64;
    auVar9._4_4_ = uVar85;
    auVar9._0_4_ = uVar84;
    auVar9._8_4_ = uVar86;
    auVar9._12_4_ = uVar87;
    local_248 = auVar32 | auVar9;
    iVar17 = movmskps(iVar17,local_248);
    if (iVar17 != 0) {
      fVar83 = (float)((uint)fVar74 & uVar50 | ~uVar50 & (uint)fVar90);
      fVar30 = (float)((uint)fVar75 & uVar62 | ~uVar62 & (uint)fVar91);
      fVar44 = (float)((uint)fVar88 & uVar63 | ~uVar63 & (uint)fVar92);
      fVar74 = (float)((uint)fVar89 & uVar64 | ~uVar64 & (uint)fVar93);
      fVar46 = (float)(~uVar50 & (uint)fVar46 | (uint)-fVar46 & uVar50);
      fVar48 = (float)(~uVar62 & (uint)fVar48 | (uint)-fVar48 & uVar62);
      fVar65 = (float)(~uVar63 & (uint)fVar65 | (uint)-fVar65 & uVar63);
      fVar73 = (float)(~uVar64 & (uint)fVar73 | (uint)-fVar73 & uVar64);
      local_1a8[0] = fVar83;
      local_1a8[1] = fVar30;
      local_1a8[2] = fVar44;
      local_1a8[3] = fVar74;
      local_198[0] = fVar106 * fVar46 - fVar98;
      local_198[1] = fVar106 * fVar48 - fVar99;
      local_198[2] = fVar106 * fVar65 - fVar100;
      local_198[3] = fVar106 * fVar73 - fVar101;
      local_188[0] = fVar109 * fVar46 - fVar94;
      local_188[1] = fVar109 * fVar48 - fVar95;
      local_188[2] = fVar109 * fVar65 - fVar96;
      local_188[3] = fVar109 * fVar73 - fVar97;
      local_178[0] = fVar46 * fVar110 - fVar102;
      local_178[1] = fVar48 * fVar110 - fVar103;
      local_178[2] = fVar65 * fVar110 - fVar104;
      local_178[3] = fVar73 * fVar110 - fVar105;
      uVar31 = local_248._0_4_;
      auVar51._0_4_ = (uint)fVar83 & uVar31;
      uVar45 = local_248._4_4_;
      auVar51._4_4_ = (uint)fVar30 & uVar45;
      uVar47 = local_248._8_4_;
      auVar51._8_4_ = (uint)fVar44 & uVar47;
      uVar49 = local_248._12_4_;
      auVar51._12_4_ = (uint)fVar74 & uVar49;
      auVar67._0_8_ = CONCAT44(~uVar45,~uVar31) & 0x7f8000007f800000;
      auVar67._8_4_ = ~uVar47 & 0x7f800000;
      auVar67._12_4_ = ~uVar49 & 0x7f800000;
      auVar67 = auVar67 | auVar51;
      auVar76._4_4_ = auVar67._0_4_;
      auVar76._0_4_ = auVar67._4_4_;
      auVar76._8_4_ = auVar67._12_4_;
      auVar76._12_4_ = auVar67._8_4_;
      auVar79 = minps(auVar76,auVar67);
      auVar52._0_8_ = auVar79._8_8_;
      auVar52._8_4_ = auVar79._0_4_;
      auVar52._12_4_ = auVar79._4_4_;
      auVar79 = minps(auVar52,auVar79);
      uVar26 = -(uint)(auVar79._0_4_ == auVar67._0_4_);
      uVar27 = -(uint)(auVar79._4_4_ == auVar67._4_4_);
      uVar28 = -(uint)(auVar79._8_4_ == auVar67._8_4_);
      uVar29 = -(uint)(auVar79._12_4_ == auVar67._12_4_);
      auVar68._0_4_ = uVar26 & uVar31;
      auVar68._4_4_ = uVar27 & uVar45;
      auVar68._8_4_ = uVar28 & uVar47;
      auVar68._12_4_ = uVar29 & uVar49;
      iVar17 = movmskps(iVar17,auVar68);
      uVar50 = 0xffffffff;
      uVar62 = 0xffffffff;
      uVar63 = 0xffffffff;
      uVar64 = 0xffffffff;
      if (iVar17 != 0) {
        uVar50 = uVar26;
        uVar62 = uVar27;
        uVar63 = uVar28;
        uVar64 = uVar29;
      }
      auVar33._0_4_ = uVar31 & uVar50;
      auVar33._4_4_ = uVar45 & uVar62;
      auVar33._8_4_ = uVar47 & uVar63;
      auVar33._12_4_ = uVar49 & uVar64;
      uVar50 = movmskps(iVar17,auVar33);
      lVar23 = 0;
      if (uVar50 != 0) {
        for (; (uVar50 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      lVar25 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      fVar89 = fVar106;
      fVar107 = fVar106;
      fVar108 = fVar106;
      fVar73 = fVar109;
      fVar75 = fVar109;
      fVar88 = fVar109;
      fVar46 = fVar110;
      fVar48 = fVar110;
      fVar65 = fVar110;
      do {
        local_208.hit = (RTCHitN *)&local_c8;
        local_208.valid = (int *)&local_228;
        local_68 = local_d8[lVar23];
        uVar20 = (ulong)local_68;
        pGVar7 = (pSVar24->geometries).items[uVar20].ptr;
        local_208.ray = (RTCRayN *)ray;
        if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_248 + lVar23 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = local_1a8[lVar23];
            *(float *)(ray + k * 4 + 0xc0) = local_198[lVar23];
            *(float *)(ray + k * 4 + 0xd0) = local_188[lVar23];
            *(float *)(ray + k * 4 + 0xe0) = local_178[lVar23];
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar23];
            *(uint *)(ray + k * 4 + 0x120) = local_68;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar50 = context->user->instPrimID[0];
            uVar19 = 0;
            *(uint *)(ray + k * 4 + 0x140) = uVar50;
LAB_00ae6393:
            fVar30 = *(float *)(ray + k * 4 + 0x80);
            local_248._0_4_ = uVar111 & -(uint)(fVar90 <= fVar30) & uVar84;
            local_248._4_4_ = uVar112 & -(uint)(fVar91 <= fVar30) & uVar85;
            local_248._8_4_ = uVar113 & -(uint)(fVar92 <= fVar30) & uVar86;
            local_248._12_4_ = uVar114 & -(uint)(fVar93 <= fVar30) & uVar87;
            auVar11._4_4_ = local_248._4_4_;
            auVar11._0_4_ = local_248._0_4_;
            auVar11._8_4_ = local_248._8_4_;
            auVar11._12_4_ = local_248._12_4_;
            iVar17 = movmskps(uVar50,auVar11);
            if (iVar17 == 0) {
              return;
            }
            fVar30 = auVar81._0_4_;
            fVar44 = auVar81._4_4_;
            fVar74 = auVar81._8_4_;
            fVar83 = auVar81._12_4_;
            local_1a8[0] = fVar90;
            local_1a8[1] = fVar91;
            local_1a8[2] = fVar92;
            local_1a8[3] = fVar93;
            local_198[0] = fVar106 * fVar30 - fVar98;
            local_198[1] = fVar89 * fVar44 - fVar99;
            local_198[2] = fVar107 * fVar74 - fVar100;
            local_198[3] = fVar108 * fVar83 - fVar101;
            local_188[0] = fVar109 * fVar30 - fVar94;
            local_188[1] = fVar73 * fVar44 - fVar95;
            local_188[2] = fVar75 * fVar74 - fVar96;
            local_188[3] = fVar88 * fVar83 - fVar97;
            local_178[0] = fVar110 * fVar30 - fVar102;
            local_178[1] = fVar46 * fVar44 - fVar103;
            local_178[2] = fVar48 * fVar74 - fVar104;
            local_178[3] = fVar65 * fVar83 - fVar105;
            pSVar24 = context->scene;
            auVar37._0_4_ = (uint)fVar90 & local_248._0_4_;
            auVar37._4_4_ = (uint)fVar91 & local_248._4_4_;
            auVar37._8_4_ = (uint)fVar92 & local_248._8_4_;
            auVar37._12_4_ = (uint)fVar93 & local_248._12_4_;
            auVar57._0_8_ = CONCAT44(~local_248._4_4_,~local_248._0_4_) & 0x7f8000007f800000;
            auVar57._8_4_ = ~local_248._8_4_ & 0x7f800000;
            auVar57._12_4_ = ~local_248._12_4_ & 0x7f800000;
            auVar57 = auVar57 | auVar37;
            auVar70._4_4_ = auVar57._0_4_;
            auVar70._0_4_ = auVar57._4_4_;
            auVar70._8_4_ = auVar57._12_4_;
            auVar70._12_4_ = auVar57._8_4_;
            auVar81 = minps(auVar70,auVar57);
            auVar38._0_8_ = auVar81._8_8_;
            auVar38._8_4_ = auVar81._0_4_;
            auVar38._12_4_ = auVar81._4_4_;
            auVar81 = minps(auVar38,auVar81);
            auVar39._0_4_ = -(uint)(auVar81._0_4_ == auVar57._0_4_) & local_248._0_4_;
            auVar39._4_4_ = -(uint)(auVar81._4_4_ == auVar57._4_4_) & local_248._4_4_;
            auVar39._8_4_ = -(uint)(auVar81._8_4_ == auVar57._8_4_) & local_248._8_4_;
            auVar39._12_4_ = -(uint)(auVar81._12_4_ == auVar57._12_4_) & local_248._12_4_;
            iVar17 = movmskps(iVar17,auVar39);
            uVar86 = local_248._0_4_;
            uVar87 = local_248._4_4_;
            uVar111 = local_248._8_4_;
            uVar112 = local_248._12_4_;
            if (iVar17 != 0) {
              uVar86 = auVar39._0_4_;
              uVar87 = auVar39._4_4_;
              uVar111 = auVar39._8_4_;
              uVar112 = auVar39._12_4_;
            }
            auVar12._4_4_ = uVar87;
            auVar12._0_4_ = uVar86;
            auVar12._8_4_ = uVar111;
            auVar12._12_4_ = uVar112;
            uVar18 = movmskps(iVar17,auVar12);
            lVar25 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
            lVar23 = 0;
            if (CONCAT44(uVar19,uVar18) != 0) {
              for (; (CONCAT44(uVar19,uVar18) >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            do {
              local_208.hit = (RTCHitN *)&local_c8;
              local_208.valid = (int *)&local_228;
              local_68 = local_d8[lVar23];
              uVar20 = (ulong)local_68;
              pGVar7 = (pSVar24->geometries).items[uVar20].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_248 + lVar23 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = local_1a8[lVar23];
                  *(float *)(ray + k * 4 + 0xc0) = local_198[lVar23];
                  *(float *)(ray + k * 4 + 0xd0) = local_188[lVar23];
                  *(float *)(ray + k * 4 + 0xe0) = local_178[lVar23];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar23];
                  *(uint *)(ray + k * 4 + 0x120) = local_68;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  return;
                }
                local_78 = (sphere->primIDs).field_0.i[lVar23];
                local_c8 = local_198[lVar23];
                local_b8 = local_188[lVar23];
                fVar102 = local_178[lVar23];
                local_a8._4_4_ = fVar102;
                local_a8._0_4_ = fVar102;
                fStack_a0 = fVar102;
                fStack_9c = fVar102;
                fStack_c4 = local_c8;
                fStack_c0 = local_c8;
                fStack_bc = local_c8;
                fStack_b4 = local_b8;
                fStack_b0 = local_b8;
                fStack_ac = local_b8;
                local_88 = 0;
                uStack_80 = 0;
                local_98 = 0;
                uStack_90 = 0;
                uStack_74 = local_78;
                uStack_70 = local_78;
                uStack_6c = local_78;
                uStack_64 = local_68;
                uStack_60 = local_68;
                uStack_5c = local_68;
                local_58 = context->user->instID[0];
                uStack_54 = local_58;
                uStack_50 = local_58;
                uStack_4c = local_58;
                local_48 = context->user->instPrimID[0];
                uStack_44 = local_48;
                uStack_40 = local_48;
                uStack_3c = local_48;
                local_1c8 = *(float *)(ray + k * 4 + 0x80);
                *(float *)(ray + k * 4 + 0x80) = local_1a8[lVar23];
                local_228 = *(undefined8 *)(mm_lookupmask_ps + lVar25);
                uStack_220 = *(undefined8 *)(mm_lookupmask_ps + lVar25 + 8);
                local_208.geometryUserPtr = pGVar7->userPtr;
                local_208.context = context->user;
                local_208.N = 4;
                p_Var21 = pGVar7->intersectionFilterN;
                local_230 = context;
                local_208.ray = (RTCRayN *)ray;
                local_1d8 = pSVar24;
                local_1b8 = fVar90;
                fStack_1b4 = fVar91;
                fStack_1b0 = fVar92;
                fStack_1ac = fVar93;
                if (p_Var21 != (RTCFilterFunctionN)0x0) {
                  p_Var21 = (RTCFilterFunctionN)(*p_Var21)(&local_208);
                }
                auVar40._0_4_ = -(uint)((int)local_228 == 0);
                auVar40._4_4_ = -(uint)(local_228._4_4_ == 0);
                auVar40._8_4_ = -(uint)((int)uStack_220 == 0);
                auVar40._12_4_ = -(uint)(uStack_220._4_4_ == 0);
                uVar86 = movmskps((int)p_Var21,auVar40);
                pRVar22 = (RayHitK<4> *)(ulong)(uVar86 ^ 0xf);
                if ((uVar86 ^ 0xf) == 0) {
                  auVar10._8_4_ = 0xffffffff;
                  auVar10._0_8_ = 0xffffffffffffffff;
                  auVar10._12_4_ = 0xffffffff;
                  auVar41 = auVar40 ^ auVar10;
                  pSVar24 = local_1d8;
                  context = local_230;
                  fVar90 = local_1b8;
                  fVar91 = fStack_1b4;
                  fVar92 = fStack_1b0;
                  fVar93 = fStack_1ac;
                }
                else {
                  p_Var21 = local_230->args->filter;
                  if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                     (((local_230->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    p_Var21 = (RTCFilterFunctionN)(*p_Var21)(&local_208);
                  }
                  auVar58._0_4_ = -(uint)((int)local_228 == 0);
                  auVar58._4_4_ = -(uint)(local_228._4_4_ == 0);
                  auVar58._8_4_ = -(uint)((int)uStack_220 == 0);
                  auVar58._12_4_ = -(uint)(uStack_220._4_4_ == 0);
                  auVar41._8_4_ = 0xffffffff;
                  auVar41._0_8_ = 0xffffffffffffffff;
                  auVar41._12_4_ = 0xffffffff;
                  auVar41 = auVar58 ^ auVar41;
                  uVar86 = movmskps((int)p_Var21,auVar58);
                  pRVar22 = (RayHitK<4> *)(ulong)(uVar86 ^ 0xf);
                  pSVar24 = local_1d8;
                  context = local_230;
                  fVar90 = local_1b8;
                  fVar91 = fStack_1b4;
                  fVar92 = fStack_1b0;
                  fVar93 = fStack_1ac;
                  if ((uVar86 ^ 0xf) != 0) {
                    fVar102 = *(float *)(local_208.hit + 4);
                    fVar103 = *(float *)(local_208.hit + 8);
                    fVar105 = *(float *)(local_208.hit + 0xc);
                    *(uint *)(local_208.ray + 0xc0) =
                         ~auVar58._0_4_ & (uint)*(float *)local_208.hit |
                         *(uint *)(local_208.ray + 0xc0) & auVar58._0_4_;
                    *(uint *)(local_208.ray + 0xc4) =
                         ~auVar58._4_4_ & (uint)fVar102 |
                         *(uint *)(local_208.ray + 0xc4) & auVar58._4_4_;
                    *(uint *)(local_208.ray + 200) =
                         ~auVar58._8_4_ & (uint)fVar103 |
                         *(uint *)(local_208.ray + 200) & auVar58._8_4_;
                    *(uint *)(local_208.ray + 0xcc) =
                         ~auVar58._12_4_ & (uint)fVar105 |
                         *(uint *)(local_208.ray + 0xcc) & auVar58._12_4_;
                    fVar102 = *(float *)(local_208.hit + 0x14);
                    fVar103 = *(float *)(local_208.hit + 0x18);
                    fVar105 = *(float *)(local_208.hit + 0x1c);
                    *(uint *)(local_208.ray + 0xd0) =
                         ~auVar58._0_4_ & (uint)*(float *)(local_208.hit + 0x10) |
                         *(uint *)(local_208.ray + 0xd0) & auVar58._0_4_;
                    *(uint *)(local_208.ray + 0xd4) =
                         ~auVar58._4_4_ & (uint)fVar102 |
                         *(uint *)(local_208.ray + 0xd4) & auVar58._4_4_;
                    *(uint *)(local_208.ray + 0xd8) =
                         ~auVar58._8_4_ & (uint)fVar103 |
                         *(uint *)(local_208.ray + 0xd8) & auVar58._8_4_;
                    *(uint *)(local_208.ray + 0xdc) =
                         ~auVar58._12_4_ & (uint)fVar105 |
                         *(uint *)(local_208.ray + 0xdc) & auVar58._12_4_;
                    auVar82._0_4_ = *(uint *)(local_208.ray + 0xe0) & auVar58._0_4_;
                    auVar82._4_4_ = *(uint *)(local_208.ray + 0xe4) & auVar58._4_4_;
                    auVar82._8_4_ = *(uint *)(local_208.ray + 0xe8) & auVar58._8_4_;
                    auVar82._12_4_ = *(uint *)(local_208.ray + 0xec) & auVar58._12_4_;
                    auVar71._0_4_ = ~auVar58._0_4_ & (uint)*(float *)(local_208.hit + 0x20);
                    auVar71._4_4_ = ~auVar58._4_4_ & (uint)*(float *)(local_208.hit + 0x24);
                    auVar71._8_4_ = ~auVar58._8_4_ & (uint)*(float *)(local_208.hit + 0x28);
                    auVar71._12_4_ = ~auVar58._12_4_ & (uint)*(float *)(local_208.hit + 0x2c);
                    *(undefined1 (*) [16])(local_208.ray + 0xe0) = auVar71 | auVar82;
                    fVar102 = *(float *)(local_208.hit + 0x34);
                    fVar103 = *(float *)(local_208.hit + 0x38);
                    fVar105 = *(float *)(local_208.hit + 0x3c);
                    *(uint *)(local_208.ray + 0xf0) =
                         ~auVar58._0_4_ & (uint)*(float *)(local_208.hit + 0x30) |
                         *(uint *)(local_208.ray + 0xf0) & auVar58._0_4_;
                    *(uint *)(local_208.ray + 0xf4) =
                         ~auVar58._4_4_ & (uint)fVar102 |
                         *(uint *)(local_208.ray + 0xf4) & auVar58._4_4_;
                    *(uint *)(local_208.ray + 0xf8) =
                         ~auVar58._8_4_ & (uint)fVar103 |
                         *(uint *)(local_208.ray + 0xf8) & auVar58._8_4_;
                    *(uint *)(local_208.ray + 0xfc) =
                         ~auVar58._12_4_ & (uint)fVar105 |
                         *(uint *)(local_208.ray + 0xfc) & auVar58._12_4_;
                    fVar102 = *(float *)(local_208.hit + 0x44);
                    fVar103 = *(float *)(local_208.hit + 0x48);
                    fVar105 = *(float *)(local_208.hit + 0x4c);
                    *(uint *)(local_208.ray + 0x100) =
                         ~auVar58._0_4_ & (uint)*(float *)(local_208.hit + 0x40) |
                         *(uint *)(local_208.ray + 0x100) & auVar58._0_4_;
                    *(uint *)(local_208.ray + 0x104) =
                         ~auVar58._4_4_ & (uint)fVar102 |
                         *(uint *)(local_208.ray + 0x104) & auVar58._4_4_;
                    *(uint *)(local_208.ray + 0x108) =
                         ~auVar58._8_4_ & (uint)fVar103 |
                         *(uint *)(local_208.ray + 0x108) & auVar58._8_4_;
                    *(uint *)(local_208.ray + 0x10c) =
                         ~auVar58._12_4_ & (uint)fVar105 |
                         *(uint *)(local_208.ray + 0x10c) & auVar58._12_4_;
                    fVar102 = *(float *)(local_208.hit + 0x54);
                    fVar103 = *(float *)(local_208.hit + 0x58);
                    fVar105 = *(float *)(local_208.hit + 0x5c);
                    *(uint *)(local_208.ray + 0x110) =
                         *(uint *)(local_208.ray + 0x110) & auVar58._0_4_ |
                         ~auVar58._0_4_ & (uint)*(float *)(local_208.hit + 0x50);
                    *(uint *)(local_208.ray + 0x114) =
                         *(uint *)(local_208.ray + 0x114) & auVar58._4_4_ |
                         ~auVar58._4_4_ & (uint)fVar102;
                    *(uint *)(local_208.ray + 0x118) =
                         *(uint *)(local_208.ray + 0x118) & auVar58._8_4_ |
                         ~auVar58._8_4_ & (uint)fVar103;
                    *(uint *)(local_208.ray + 0x11c) =
                         *(uint *)(local_208.ray + 0x11c) & auVar58._12_4_ |
                         ~auVar58._12_4_ & (uint)fVar105;
                    fVar102 = *(float *)(local_208.hit + 100);
                    fVar103 = *(float *)(local_208.hit + 0x68);
                    fVar105 = *(float *)(local_208.hit + 0x6c);
                    *(uint *)(local_208.ray + 0x120) =
                         *(uint *)(local_208.ray + 0x120) & auVar58._0_4_ |
                         ~auVar58._0_4_ & (uint)*(float *)(local_208.hit + 0x60);
                    *(uint *)(local_208.ray + 0x124) =
                         *(uint *)(local_208.ray + 0x124) & auVar58._4_4_ |
                         ~auVar58._4_4_ & (uint)fVar102;
                    *(uint *)(local_208.ray + 0x128) =
                         *(uint *)(local_208.ray + 0x128) & auVar58._8_4_ |
                         ~auVar58._8_4_ & (uint)fVar103;
                    *(uint *)(local_208.ray + 300) =
                         *(uint *)(local_208.ray + 300) & auVar58._12_4_ |
                         ~auVar58._12_4_ & (uint)fVar105;
                    fVar102 = *(float *)(local_208.hit + 0x74);
                    fVar103 = *(float *)(local_208.hit + 0x78);
                    fVar105 = *(float *)(local_208.hit + 0x7c);
                    *(uint *)(local_208.ray + 0x130) =
                         ~auVar58._0_4_ & (uint)*(float *)(local_208.hit + 0x70) |
                         *(uint *)(local_208.ray + 0x130) & auVar58._0_4_;
                    *(uint *)(local_208.ray + 0x134) =
                         ~auVar58._4_4_ & (uint)fVar102 |
                         *(uint *)(local_208.ray + 0x134) & auVar58._4_4_;
                    *(uint *)(local_208.ray + 0x138) =
                         ~auVar58._8_4_ & (uint)fVar103 |
                         *(uint *)(local_208.ray + 0x138) & auVar58._8_4_;
                    *(uint *)(local_208.ray + 0x13c) =
                         ~auVar58._12_4_ & (uint)fVar105 |
                         *(uint *)(local_208.ray + 0x13c) & auVar58._12_4_;
                    *(undefined1 (*) [16])(local_208.ray + 0x140) =
                         ~auVar58 & *(undefined1 (*) [16])(local_208.hit + 0x80) |
                         *(undefined1 (*) [16])(local_208.ray + 0x140) & auVar58;
                    pRVar22 = (RayHitK<4> *)local_208.ray;
                  }
                }
                auVar43._0_4_ = auVar41._0_4_ << 0x1f;
                auVar43._4_4_ = auVar41._4_4_ << 0x1f;
                auVar43._8_4_ = auVar41._8_4_ << 0x1f;
                auVar43._12_4_ = auVar41._12_4_ << 0x1f;
                iVar17 = movmskps((int)pRVar22,auVar43);
                uVar20 = CONCAT44((int)((ulong)pRVar22 >> 0x20),iVar17);
                if (iVar17 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = local_1c8;
                }
                *(undefined4 *)(local_248 + lVar23 * 4) = 0;
                fVar102 = *(float *)(ray + k * 4 + 0x80);
                local_248._4_4_ = -(uint)(fVar91 <= fVar102) & local_248._4_4_;
                local_248._0_4_ = -(uint)(fVar90 <= fVar102) & local_248._0_4_;
                local_248._8_4_ = -(uint)(fVar92 <= fVar102) & local_248._8_4_;
                local_248._12_4_ = -(uint)(fVar93 <= fVar102) & local_248._12_4_;
              }
              uVar86 = local_248._0_4_;
              uVar87 = local_248._4_4_;
              uVar111 = local_248._8_4_;
              uVar112 = local_248._12_4_;
              iVar17 = movmskps((int)uVar20,local_248);
              if (iVar17 == 0) {
                return;
              }
              auVar59._0_4_ = uVar86 & (uint)fVar90;
              auVar59._4_4_ = uVar87 & (uint)fVar91;
              auVar59._8_4_ = uVar111 & (uint)fVar92;
              auVar59._12_4_ = uVar112 & (uint)fVar93;
              auVar72._0_8_ = CONCAT44(~uVar87,~uVar86) & 0x7f8000007f800000;
              auVar72._8_4_ = ~uVar111 & 0x7f800000;
              auVar72._12_4_ = ~uVar112 & 0x7f800000;
              auVar72 = auVar72 | auVar59;
              auVar78._4_4_ = auVar72._0_4_;
              auVar78._0_4_ = auVar72._4_4_;
              auVar78._8_4_ = auVar72._12_4_;
              auVar78._12_4_ = auVar72._8_4_;
              auVar81 = minps(auVar78,auVar72);
              auVar60._0_8_ = auVar81._8_8_;
              auVar60._8_4_ = auVar81._0_4_;
              auVar60._12_4_ = auVar81._4_4_;
              auVar81 = minps(auVar60,auVar81);
              auVar61._0_8_ =
                   CONCAT44(-(uint)(auVar81._4_4_ == auVar72._4_4_) & uVar87,
                            -(uint)(auVar81._0_4_ == auVar72._0_4_) & uVar86);
              auVar61._8_4_ = -(uint)(auVar81._8_4_ == auVar72._8_4_) & uVar111;
              auVar61._12_4_ = -(uint)(auVar81._12_4_ == auVar72._12_4_) & uVar112;
              iVar17 = movmskps(iVar17,auVar61);
              auVar42 = local_248;
              if (iVar17 != 0) {
                auVar42._8_4_ = auVar61._8_4_;
                auVar42._0_8_ = auVar61._0_8_;
                auVar42._12_4_ = auVar61._12_4_;
              }
              uVar19 = movmskps(iVar17,auVar42);
              uVar20 = CONCAT44((int)(uVar20 >> 0x20),uVar19);
              lVar23 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
            } while( true );
          }
          local_158 = auVar81;
          local_78 = (sphere->primIDs).field_0.i[lVar23];
          local_c8 = local_198[lVar23];
          local_b8 = local_188[lVar23];
          local_a8._4_4_ = local_178[lVar23];
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          local_a8._0_4_ = local_a8._4_4_;
          fStack_a0 = (float)local_a8._4_4_;
          fStack_9c = (float)local_a8._4_4_;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          local_58 = context->user->instID[0];
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          local_48 = context->user->instPrimID[0];
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          local_20c = *(undefined4 *)(ray + k * 4 + 0x80);
          *(float *)(ray + k * 4 + 0x80) = local_1a8[lVar23];
          local_228 = *(undefined8 *)(mm_lookupmask_ps + lVar25);
          uStack_220 = *(undefined8 *)(mm_lookupmask_ps + lVar25 + 8);
          local_208.geometryUserPtr = pGVar7->userPtr;
          local_208.context = context->user;
          local_208.N = 4;
          p_Var21 = pGVar7->intersectionFilterN;
          local_e8 = fVar94;
          fStack_e4 = fVar95;
          fStack_e0 = fVar96;
          fStack_dc = fVar97;
          local_f8 = fVar98;
          fStack_f4 = fVar99;
          fStack_f0 = fVar100;
          fStack_ec = fVar101;
          local_108 = fVar102;
          fStack_104 = fVar103;
          fStack_100 = fVar104;
          fStack_fc = fVar105;
          local_160 = pSVar24;
          local_118 = fVar106;
          fStack_114 = fVar89;
          fStack_110 = fVar107;
          fStack_10c = fVar108;
          local_128 = fVar109;
          fStack_124 = fVar73;
          fStack_120 = fVar75;
          fStack_11c = fVar88;
          local_138 = fVar110;
          fStack_134 = fVar46;
          fStack_130 = fVar48;
          fStack_12c = fVar65;
          local_148 = uVar111;
          uStack_144 = uVar112;
          uStack_140 = uVar113;
          uStack_13c = uVar114;
          local_230 = context;
          uStack_1d0 = uVar86;
          uStack_1cc = uVar87;
          local_1c8 = fVar83;
          fStack_1c4 = fVar30;
          fStack_1c0 = fVar44;
          fStack_1bc = fVar74;
          local_1b8 = fVar90;
          fStack_1b4 = fVar91;
          fStack_1b0 = fVar92;
          fStack_1ac = fVar93;
          local_1d8._0_4_ = uVar84;
          local_1d8._4_4_ = uVar85;
          if (p_Var21 != (RTCFilterFunctionN)0x0) {
            p_Var21 = (RTCFilterFunctionN)(*p_Var21)(&local_208);
          }
          auVar34._0_4_ = -(uint)((int)local_228 == 0);
          auVar34._4_4_ = -(uint)(local_228._4_4_ == 0);
          auVar34._8_4_ = -(uint)((int)uStack_220 == 0);
          auVar34._12_4_ = -(uint)(uStack_220._4_4_ == 0);
          uVar86 = movmskps((int)p_Var21,auVar34);
          pRVar22 = (RayHitK<4> *)(ulong)(uVar86 ^ 0xf);
          if ((uVar86 ^ 0xf) == 0) {
            auVar34 = auVar34 ^ _DAT_01febe20;
            context = local_230;
            uVar84 = (uint)local_1d8;
            uVar85 = local_1d8._4_4_;
            fVar90 = local_1b8;
            fVar91 = fStack_1b4;
            fVar92 = fStack_1b0;
            fVar93 = fStack_1ac;
            fVar83 = local_1c8;
          }
          else {
            p_Var21 = local_230->args->filter;
            if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
               (((local_230->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              p_Var21 = (RTCFilterFunctionN)(*p_Var21)(&local_208);
            }
            auVar53._0_4_ = -(uint)((int)local_228 == 0);
            auVar53._4_4_ = -(uint)(local_228._4_4_ == 0);
            auVar53._8_4_ = -(uint)((int)uStack_220 == 0);
            auVar53._12_4_ = -(uint)(uStack_220._4_4_ == 0);
            auVar34 = auVar53 ^ _DAT_01febe20;
            uVar86 = movmskps((int)p_Var21,auVar53);
            pRVar22 = (RayHitK<4> *)(ulong)(uVar86 ^ 0xf);
            context = local_230;
            uVar84 = (uint)local_1d8;
            uVar85 = local_1d8._4_4_;
            fVar90 = local_1b8;
            fVar91 = fStack_1b4;
            fVar92 = fStack_1b0;
            fVar93 = fStack_1ac;
            fVar83 = local_1c8;
            if ((uVar86 ^ 0xf) != 0) {
              fVar102 = *(float *)(local_208.hit + 4);
              fVar103 = *(float *)(local_208.hit + 8);
              fVar105 = *(float *)(local_208.hit + 0xc);
              *(uint *)(local_208.ray + 0xc0) =
                   ~auVar53._0_4_ & (uint)*(float *)local_208.hit |
                   *(uint *)(local_208.ray + 0xc0) & auVar53._0_4_;
              *(uint *)(local_208.ray + 0xc4) =
                   ~auVar53._4_4_ & (uint)fVar102 | *(uint *)(local_208.ray + 0xc4) & auVar53._4_4_;
              *(uint *)(local_208.ray + 200) =
                   ~auVar53._8_4_ & (uint)fVar103 | *(uint *)(local_208.ray + 200) & auVar53._8_4_;
              *(uint *)(local_208.ray + 0xcc) =
                   ~auVar53._12_4_ & (uint)fVar105 |
                   *(uint *)(local_208.ray + 0xcc) & auVar53._12_4_;
              fVar102 = *(float *)(local_208.hit + 0x14);
              fVar103 = *(float *)(local_208.hit + 0x18);
              fVar105 = *(float *)(local_208.hit + 0x1c);
              *(uint *)(local_208.ray + 0xd0) =
                   ~auVar53._0_4_ & (uint)*(float *)(local_208.hit + 0x10) |
                   *(uint *)(local_208.ray + 0xd0) & auVar53._0_4_;
              *(uint *)(local_208.ray + 0xd4) =
                   ~auVar53._4_4_ & (uint)fVar102 | *(uint *)(local_208.ray + 0xd4) & auVar53._4_4_;
              *(uint *)(local_208.ray + 0xd8) =
                   ~auVar53._8_4_ & (uint)fVar103 | *(uint *)(local_208.ray + 0xd8) & auVar53._8_4_;
              *(uint *)(local_208.ray + 0xdc) =
                   ~auVar53._12_4_ & (uint)fVar105 |
                   *(uint *)(local_208.ray + 0xdc) & auVar53._12_4_;
              fVar102 = *(float *)(local_208.hit + 0x24);
              fVar103 = *(float *)(local_208.hit + 0x28);
              fVar105 = *(float *)(local_208.hit + 0x2c);
              *(uint *)(local_208.ray + 0xe0) =
                   ~auVar53._0_4_ & (uint)*(float *)(local_208.hit + 0x20) |
                   *(uint *)(local_208.ray + 0xe0) & auVar53._0_4_;
              *(uint *)(local_208.ray + 0xe4) =
                   ~auVar53._4_4_ & (uint)fVar102 | *(uint *)(local_208.ray + 0xe4) & auVar53._4_4_;
              *(uint *)(local_208.ray + 0xe8) =
                   ~auVar53._8_4_ & (uint)fVar103 | *(uint *)(local_208.ray + 0xe8) & auVar53._8_4_;
              *(uint *)(local_208.ray + 0xec) =
                   ~auVar53._12_4_ & (uint)fVar105 |
                   *(uint *)(local_208.ray + 0xec) & auVar53._12_4_;
              fVar102 = *(float *)(local_208.hit + 0x34);
              fVar103 = *(float *)(local_208.hit + 0x38);
              fVar105 = *(float *)(local_208.hit + 0x3c);
              *(uint *)(local_208.ray + 0xf0) =
                   ~auVar53._0_4_ & (uint)*(float *)(local_208.hit + 0x30) |
                   *(uint *)(local_208.ray + 0xf0) & auVar53._0_4_;
              *(uint *)(local_208.ray + 0xf4) =
                   ~auVar53._4_4_ & (uint)fVar102 | *(uint *)(local_208.ray + 0xf4) & auVar53._4_4_;
              *(uint *)(local_208.ray + 0xf8) =
                   ~auVar53._8_4_ & (uint)fVar103 | *(uint *)(local_208.ray + 0xf8) & auVar53._8_4_;
              *(uint *)(local_208.ray + 0xfc) =
                   ~auVar53._12_4_ & (uint)fVar105 |
                   *(uint *)(local_208.ray + 0xfc) & auVar53._12_4_;
              fVar102 = *(float *)(local_208.hit + 0x44);
              fVar103 = *(float *)(local_208.hit + 0x48);
              fVar105 = *(float *)(local_208.hit + 0x4c);
              *(uint *)(local_208.ray + 0x100) =
                   ~auVar53._0_4_ & (uint)*(float *)(local_208.hit + 0x40) |
                   *(uint *)(local_208.ray + 0x100) & auVar53._0_4_;
              *(uint *)(local_208.ray + 0x104) =
                   ~auVar53._4_4_ & (uint)fVar102 | *(uint *)(local_208.ray + 0x104) & auVar53._4_4_
              ;
              *(uint *)(local_208.ray + 0x108) =
                   ~auVar53._8_4_ & (uint)fVar103 | *(uint *)(local_208.ray + 0x108) & auVar53._8_4_
              ;
              *(uint *)(local_208.ray + 0x10c) =
                   ~auVar53._12_4_ & (uint)fVar105 |
                   *(uint *)(local_208.ray + 0x10c) & auVar53._12_4_;
              fVar102 = *(float *)(local_208.hit + 0x54);
              fVar103 = *(float *)(local_208.hit + 0x58);
              fVar105 = *(float *)(local_208.hit + 0x5c);
              *(uint *)(local_208.ray + 0x110) =
                   *(uint *)(local_208.ray + 0x110) & auVar53._0_4_ |
                   ~auVar53._0_4_ & (uint)*(float *)(local_208.hit + 0x50);
              *(uint *)(local_208.ray + 0x114) =
                   *(uint *)(local_208.ray + 0x114) & auVar53._4_4_ | ~auVar53._4_4_ & (uint)fVar102
              ;
              *(uint *)(local_208.ray + 0x118) =
                   *(uint *)(local_208.ray + 0x118) & auVar53._8_4_ | ~auVar53._8_4_ & (uint)fVar103
              ;
              *(uint *)(local_208.ray + 0x11c) =
                   *(uint *)(local_208.ray + 0x11c) & auVar53._12_4_ |
                   ~auVar53._12_4_ & (uint)fVar105;
              fVar102 = *(float *)(local_208.hit + 100);
              fVar103 = *(float *)(local_208.hit + 0x68);
              fVar105 = *(float *)(local_208.hit + 0x6c);
              *(uint *)(local_208.ray + 0x120) =
                   *(uint *)(local_208.ray + 0x120) & auVar53._0_4_ |
                   ~auVar53._0_4_ & (uint)*(float *)(local_208.hit + 0x60);
              *(uint *)(local_208.ray + 0x124) =
                   *(uint *)(local_208.ray + 0x124) & auVar53._4_4_ | ~auVar53._4_4_ & (uint)fVar102
              ;
              *(uint *)(local_208.ray + 0x128) =
                   *(uint *)(local_208.ray + 0x128) & auVar53._8_4_ | ~auVar53._8_4_ & (uint)fVar103
              ;
              *(uint *)(local_208.ray + 300) =
                   *(uint *)(local_208.ray + 300) & auVar53._12_4_ | ~auVar53._12_4_ & (uint)fVar105
              ;
              fVar102 = *(float *)(local_208.hit + 0x74);
              fVar103 = *(float *)(local_208.hit + 0x78);
              fVar105 = *(float *)(local_208.hit + 0x7c);
              *(uint *)(local_208.ray + 0x130) =
                   ~auVar53._0_4_ & (uint)*(float *)(local_208.hit + 0x70) |
                   *(uint *)(local_208.ray + 0x130) & auVar53._0_4_;
              *(uint *)(local_208.ray + 0x134) =
                   ~auVar53._4_4_ & (uint)fVar102 | *(uint *)(local_208.ray + 0x134) & auVar53._4_4_
              ;
              *(uint *)(local_208.ray + 0x138) =
                   ~auVar53._8_4_ & (uint)fVar103 | *(uint *)(local_208.ray + 0x138) & auVar53._8_4_
              ;
              *(uint *)(local_208.ray + 0x13c) =
                   ~auVar53._12_4_ & (uint)fVar105 |
                   *(uint *)(local_208.ray + 0x13c) & auVar53._12_4_;
              *(undefined1 (*) [16])(local_208.ray + 0x140) =
                   ~auVar53 & *(undefined1 (*) [16])(local_208.hit + 0x80) |
                   *(undefined1 (*) [16])(local_208.ray + 0x140) & auVar53;
              pRVar22 = (RayHitK<4> *)local_208.ray;
            }
          }
          fVar97 = fStack_dc;
          fVar96 = fStack_e0;
          fVar95 = fStack_e4;
          fVar94 = local_e8;
          fVar101 = fStack_ec;
          fVar100 = fStack_f0;
          fVar99 = fStack_f4;
          fVar98 = local_f8;
          fVar105 = fStack_fc;
          fVar104 = fStack_100;
          fVar103 = fStack_104;
          fVar102 = local_108;
          fVar108 = fStack_10c;
          fVar107 = fStack_110;
          fVar89 = fStack_114;
          fVar106 = local_118;
          fVar88 = fStack_11c;
          fVar75 = fStack_120;
          fVar73 = fStack_124;
          fVar109 = local_128;
          fVar65 = fStack_12c;
          fVar48 = fStack_130;
          fVar46 = fStack_134;
          fVar110 = local_138;
          uVar114 = uStack_13c;
          uVar113 = uStack_140;
          uVar112 = uStack_144;
          uVar111 = local_148;
          auVar81 = local_158;
          pSVar24 = local_160;
          fVar74 = fStack_1bc;
          fVar44 = fStack_1c0;
          fVar30 = fStack_1c4;
          uVar87 = uStack_1cc;
          uVar86 = uStack_1d0;
          auVar36._0_4_ = auVar34._0_4_ << 0x1f;
          auVar36._4_4_ = auVar34._4_4_ << 0x1f;
          auVar36._8_4_ = auVar34._8_4_ << 0x1f;
          auVar36._12_4_ = auVar34._12_4_ << 0x1f;
          iVar17 = movmskps((int)pRVar22,auVar36);
          uVar20 = CONCAT44((int)((ulong)pRVar22 >> 0x20),iVar17);
          if (iVar17 == 0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_20c;
          }
          *(undefined4 *)(local_248 + lVar23 * 4) = 0;
          fVar5 = *(float *)(ray + k * 4 + 0x80);
          local_248._4_4_ = -(uint)(fVar30 <= fVar5) & local_248._4_4_;
          local_248._0_4_ = -(uint)(fVar83 <= fVar5) & local_248._0_4_;
          local_248._8_4_ = -(uint)(fVar44 <= fVar5) & local_248._8_4_;
          local_248._12_4_ = -(uint)(fVar74 <= fVar5) & local_248._12_4_;
        }
        uVar62 = local_248._0_4_;
        uVar63 = local_248._4_4_;
        uVar64 = local_248._8_4_;
        uVar26 = local_248._12_4_;
        uVar19 = (undefined4)(uVar20 >> 0x20);
        uVar50 = movmskps((int)uVar20,local_248);
        if (uVar50 == 0) goto LAB_00ae6393;
        auVar54._0_4_ = uVar62 & (uint)fVar83;
        auVar54._4_4_ = uVar63 & (uint)fVar30;
        auVar54._8_4_ = uVar64 & (uint)fVar44;
        auVar54._12_4_ = uVar26 & (uint)fVar74;
        auVar69._0_8_ = CONCAT44(~uVar63,~uVar62) & 0x7f8000007f800000;
        auVar69._8_4_ = ~uVar64 & 0x7f800000;
        auVar69._12_4_ = ~uVar26 & 0x7f800000;
        auVar69 = auVar69 | auVar54;
        auVar77._4_4_ = auVar69._0_4_;
        auVar77._0_4_ = auVar69._4_4_;
        auVar77._8_4_ = auVar69._12_4_;
        auVar77._12_4_ = auVar69._8_4_;
        auVar79 = minps(auVar77,auVar69);
        auVar55._0_8_ = auVar79._8_8_;
        auVar55._8_4_ = auVar79._0_4_;
        auVar55._12_4_ = auVar79._4_4_;
        auVar79 = minps(auVar55,auVar79);
        auVar56._0_8_ =
             CONCAT44(-(uint)(auVar79._4_4_ == auVar69._4_4_) & uVar63,
                      -(uint)(auVar79._0_4_ == auVar69._0_4_) & uVar62);
        auVar56._8_4_ = -(uint)(auVar79._8_4_ == auVar69._8_4_) & uVar64;
        auVar56._12_4_ = -(uint)(auVar79._12_4_ == auVar69._12_4_) & uVar26;
        iVar17 = movmskps(uVar50,auVar56);
        auVar35 = local_248;
        if (iVar17 != 0) {
          auVar35._8_4_ = auVar56._8_4_;
          auVar35._0_8_ = auVar56._0_8_;
          auVar35._12_4_ = auVar56._12_4_;
        }
        uVar18 = movmskps(iVar17,auVar35);
        lVar23 = 0;
        if (CONCAT44(uVar19,uVar18) != 0) {
          for (; (CONCAT44(uVar19,uVar18) >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }